

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

MemberSyntax * __thiscall
slang::parsing::Parser::parseMember(Parser *this,SyntaxKind parentKind,bool *anyLocalModules)

{
  SyntaxFactory *this_00;
  BumpAllocator *alloc;
  bool bVar1;
  TokenKind TVar2;
  SyntaxKind SVar3;
  int iVar4;
  HierarchyInstantiationSyntax *pHVar5;
  PortDeclarationSyntax *pPVar6;
  MemberSyntax *pMVar7;
  DPIExportSyntax *pDVar8;
  StatementSyntax *pSVar9;
  ProceduralBlockSyntax *pPVar10;
  UdpDeclarationSyntax *pUVar11;
  CheckerInstantiationSyntax *pCVar12;
  SequenceDeclarationSyntax *pSVar13;
  ImmediateAssertionMemberSyntax *pIVar14;
  ModuleDeclarationSyntax *pMVar15;
  TimeUnitsDeclarationSyntax *pTVar16;
  PropertyDeclarationSyntax *pPVar17;
  DPIImportSyntax *pDVar18;
  IfGenerateSyntax *pIVar19;
  GenvarDeclarationSyntax *pGVar20;
  GenerateRegionSyntax *pGVar21;
  LoopGenerateSyntax *pLVar22;
  FunctionDeclarationSyntax *pFVar23;
  ConfigDeclarationSyntax *pCVar24;
  BindDirectiveSyntax *pBVar25;
  CaseGenerateSyntax *pCVar26;
  CheckerDeclarationSyntax *pCVar27;
  ContinuousAssignSyntax *pCVar28;
  DefParamSyntax *pDVar29;
  NetAliasSyntax *pNVar30;
  CovergroupDeclarationSyntax *pCVar31;
  ModportDeclarationSyntax *pMVar32;
  ClassDeclarationSyntax *pCVar33;
  DataDeclarationSyntax *data;
  CheckerDataDeclarationSyntax *pCVar34;
  SpecifyBlockSyntax *pSVar35;
  ConcurrentAssertionStatementSyntax *pCVar36;
  ConcurrentAssertionMemberSyntax *pCVar37;
  SpecparamDeclarationSyntax *pSVar38;
  PrimitiveInstantiationSyntax *pPVar39;
  NamedLabelSyntax *label;
  ImmediateAssertionStatementSyntax *pIVar40;
  PackageImportDeclarationSyntax *pPVar41;
  Diagnostic *this_01;
  undefined4 extraout_var;
  SourceLocation SVar42;
  EmptyMemberSyntax *pEVar43;
  uint uVar44;
  size_type sVar45;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *src;
  size_type extraout_RDX_03;
  TokenKind endKind;
  anon_class_8_1_8991fb9c *in_R8;
  FunctionDeclarationSyntax *unaff_R12;
  uint32_t offset;
  AttrList attributes;
  Token TVar46;
  SourceRange SVar47;
  Token name;
  Token colon;
  string_view arg;
  Token TVar48;
  span<slang::parsing::Token,_18446744073709551615UL> qualifiers;
  Token token;
  Token endgenerate;
  SmallVector<slang::parsing::Token,_4UL> quals;
  Token local_f0;
  SyntaxFactory *local_e0;
  Token local_d8;
  undefined1 local_c8 [32];
  AttrList local_a8;
  TokenList local_70;
  Token local_40;
  
  attributes = parseAttributes(this);
  sVar45 = attributes.size_;
  bVar1 = isHierarchyInstantiation(this,false);
  if (bVar1) {
    pHVar5 = parseHierarchyInstantiation(this,attributes);
    return &pHVar5->super_MemberSyntax;
  }
  bVar1 = isPortDeclaration(this,false);
  if (bVar1) {
    pPVar6 = parsePortDeclaration(this,attributes);
    return &pPVar6->super_MemberSyntax;
  }
  bVar1 = isNetDeclaration(this);
  if (bVar1) {
    pMVar7 = parseNetDeclaration(this,attributes);
    return pMVar7;
  }
  bVar1 = isVariableDeclaration(this);
  if (bVar1) {
LAB_00324b7d:
    pMVar7 = parseVariableDeclaration(this,attributes);
    return pMVar7;
  }
  local_f0 = ParserBase::peek(&this->super_ParserBase);
  TVar2 = local_f0.kind;
  if (ExpectKeyword < TVar2) {
    if (TVar2 < PackageKeyword) {
      if (TVar2 < InitialKeyword) {
        SVar3 = 0x413cf8;
        switch(TVar2) {
        case ExportKeyword:
          TVar46 = ParserBase::peek(&this->super_ParserBase,1);
          if (TVar46.kind == StringLiteral) {
            pDVar8 = parseDPIExport(this,attributes);
            return &pDVar8->super_MemberSyntax;
          }
          pMVar7 = parseExportDeclaration(this,attributes);
          return pMVar7;
        case ExternKeyword:
          errorIfAttributes(this,attributes);
          unaff_R12 = (FunctionDeclarationSyntax *)parseExternMember(this,parentKind,attributes);
          goto LAB_0032558f;
        case FinalKeyword:
          goto switchD_00324bea_caseD_a9;
        case ForKeyword:
          pLVar22 = parseLoopGenerateConstruct(this,attributes);
          return &pLVar22->super_MemberSyntax;
        case FunctionKeyword:
          SVar3 = FunctionDeclaration;
          endKind = EndFunctionKeyword;
LAB_003251ab:
          pFVar23 = parseFunctionDeclaration(this,attributes,SVar3,endKind,parentKind);
          return &pFVar23->super_MemberSyntax;
        case GenerateKeyword:
          errorIfAttributes(this,attributes);
          TVar46 = ParserBase::consume(&this->super_ParserBase);
          Token::Token(&local_d8);
          local_c8._0_8_ = this;
          local_70.super_span<slang::parsing::Token,_18446744073709551615UL> =
               (span<slang::parsing::Token,_18446744073709551615UL>)
               parseMemberList<slang::syntax::MemberSyntax,slang::parsing::Parser::parseMember(slang::syntax::SyntaxKind,bool&)::__0>
                         (this,(TokenKind)&local_d8,(Token *)local_c8,SVar3,in_R8);
          local_70.super_SyntaxListBase.childCount =
               local_70.super_span<slang::parsing::Token,_18446744073709551615UL>.size_;
          local_c8._8_8_ = (SyntaxNode *)0x0;
          local_c8._16_4_ = SyntaxList;
          local_c8._0_8_ = &PTR_getChild_004ea348;
          local_70.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
          local_70.super_SyntaxListBase._0_16_ = ZEXT816(0x4ed010);
          local_c8._24_8_ = sVar45;
          local_a8 = attributes;
          pGVar21 = slang::syntax::SyntaxFactory::generateRegion
                              (&this->factory,
                               (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_c8,TVar46
                               ,(SyntaxList<slang::syntax::MemberSyntax> *)&local_70,local_d8);
          return &pGVar21->super_MemberSyntax;
        case GenVarKeyword:
          pGVar20 = parseGenvarDeclaration(this,attributes);
          return &pGVar20->super_MemberSyntax;
        case GlobalKeyword:
          goto switchD_00324bea_caseD_b4;
        case IfKeyword:
          pIVar19 = parseIfGenerateConstruct(this,attributes);
          return &pIVar19->super_MemberSyntax;
        case ImportKeyword:
          TVar46 = ParserBase::peek(&this->super_ParserBase,1);
          if (TVar46.kind == StringLiteral) {
            pDVar18 = parseDPIImport(this,attributes);
            return &pDVar18->super_MemberSyntax;
          }
          pPVar41 = parseImportDeclaration(this,attributes);
          return &pPVar41->super_MemberSyntax;
        }
      }
      else if (TVar2 < MacromoduleKeyword) {
        if (TVar2 == InitialKeyword) {
          TVar48 = ParserBase::consume(&this->super_ParserBase);
          local_e0 = &this->factory;
          SVar3 = slang::syntax::SyntaxFacts::getProceduralBlockKind(TVar48.kind);
          bVar1 = true;
          goto LAB_00324c9f;
        }
        if (TVar2 == InterfaceKeyword) {
          TVar46 = ParserBase::peek(&this->super_ParserBase,1);
          if (TVar46.kind == ClassKeyword) goto LAB_00325438;
          goto switchD_00324cf4_caseD_e9;
        }
      }
      else {
        if (TVar2 == MacromoduleKeyword) {
switchD_00324cf4_caseD_e9:
          pMVar15 = parseModule(this,attributes,parentKind,anyLocalModules);
          return &pMVar15->super_MemberSyntax;
        }
        if (TVar2 == ModPortKeyword) {
          pMVar32 = parseModportDeclaration(this,attributes);
          return &pMVar32->super_MemberSyntax;
        }
        if (TVar2 == ModuleKeyword) goto switchD_00324cf4_caseD_e9;
      }
    }
    else if (TVar2 < SpecifyKeyword) {
      if (TVar2 < RandKeyword) {
        switch(TVar2) {
        case PackageKeyword:
        case ProgramKeyword:
          goto switchD_00324cf4_caseD_e9;
        case PrimitiveKeyword:
          pUVar11 = parseUdpDeclaration(this,attributes);
          return &pUVar11->super_MemberSyntax;
        case PropertyKeyword:
          pPVar17 = parsePropertyDeclaration(this,attributes);
          return &pPVar17->super_MemberSyntax;
        }
      }
      else {
        if (TVar2 == RandKeyword) {
          TVar46 = ParserBase::consume(&this->super_ParserBase);
          local_c8._8_8_ = (SyntaxNode *)0x0;
          local_c8._16_4_ = SyntaxList;
          local_c8._0_8_ = &PTR_getChild_004ea348;
          local_c8._24_8_ = sVar45;
          local_a8 = attributes;
          data = parseDataDeclaration(this,(AttrList)ZEXT816(0));
          pCVar34 = slang::syntax::SyntaxFactory::checkerDataDeclaration
                              (&this->factory,
                               (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_c8,TVar46
                               ,data);
          return &pCVar34->super_MemberSyntax;
        }
        if (TVar2 == RestrictKeyword) {
          pCVar36 = parseConcurrentAssertion(this,(NamedLabelSyntax *)0x0,(AttrList)ZEXT816(0));
          goto LAB_0032550f;
        }
        if (TVar2 == SequenceKeyword) {
          pSVar13 = parseSequenceDeclaration(this,attributes);
          return &pSVar13->super_MemberSyntax;
        }
      }
    }
    else if (TVar2 < TimePrecisionKeyword) {
      if (TVar2 == SpecifyKeyword) {
        errorIfAttributes(this,attributes);
        pSVar35 = parseSpecifyBlock(this,attributes);
        return &pSVar35->super_MemberSyntax;
      }
      if (TVar2 == SpecParamKeyword) {
        pSVar38 = parseSpecparam(this,attributes);
        return &pSVar38->super_MemberSyntax;
      }
      if (TVar2 == TaskKeyword) {
        SVar3 = TaskDeclaration;
        endKind = EndTaskKeyword;
        goto LAB_003251ab;
      }
    }
    else {
      if (TVar2 - 0x12e < 2) {
        errorIfAttributes(this,attributes);
        pTVar16 = parseTimeUnitsDeclaration(this,attributes);
        return &pTVar16->super_MemberSyntax;
      }
      if (TVar2 == VirtualKeyword) {
        TVar46 = ParserBase::peek(&this->super_ParserBase,1);
        if (TVar46.kind == ClassKeyword) {
LAB_00325438:
          TVar46 = ParserBase::consume(&this->super_ParserBase);
          pCVar33 = parseClassDeclaration(this,attributes,TVar46);
          return &pCVar33->super_MemberSyntax;
        }
      }
      else if (TVar2 == UnitSystemName) {
        TVar46 = ParserBase::peek(&this->super_ParserBase,1);
        if (((TVar46.kind == DoubleColon) &&
            (TVar46 = ParserBase::peek(&this->super_ParserBase,2), TVar46.kind == Identifier)) &&
           (TVar46 = ParserBase::peek(&this->super_ParserBase,3), TVar46.kind == Identifier)) {
          pCVar12 = parseCheckerInstantiation(this,attributes);
          return &pCVar12->super_MemberSyntax;
        }
        goto LAB_00324b7d;
      }
    }
    goto switchD_00324bea_caseD_a7;
  }
  if (TVar2 < AliasKeyword) {
    if (TVar2 == Identifier) {
      TVar46 = ParserBase::peek(&this->super_ParserBase,1);
      if (TVar46.kind == Colon) {
        TVar46 = ParserBase::peek(&this->super_ParserBase,2);
        uVar44 = TVar46.kind - 0x65;
        if ((uVar44 < 0x1e) && ((0x20000005U >> (uVar44 & 0x1f) & 1) != 0)) {
          name = ParserBase::consume(&this->super_ParserBase);
          this_00 = &this->factory;
          colon = ParserBase::expect(&this->super_ParserBase,Colon);
          label = slang::syntax::SyntaxFactory::namedLabel(this_00,name,colon);
          pSVar9 = parseAssertionStatement(this,label,(AttrList)ZEXT816(0));
          uVar44 = (pSVar9->super_SyntaxNode).kind - ImmediateAssertStatement;
          if ((uVar44 < 4) && (uVar44 != 1)) {
            local_c8._8_8_ = (SyntaxNode *)0x0;
            local_c8._16_4_ = SyntaxList;
            local_c8._0_8_ = &PTR_getChild_004ea348;
            local_c8._24_8_ = sVar45;
            local_a8 = attributes;
            pIVar40 = slang::syntax::SyntaxNode::
                      as<slang::syntax::ImmediateAssertionStatementSyntax>
                                (&pSVar9->super_SyntaxNode);
            unaff_R12 = (FunctionDeclarationSyntax *)
                        slang::syntax::SyntaxFactory::immediateAssertionMember
                                  (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                                           local_c8,pIVar40);
          }
          else {
            local_c8._8_8_ = (SyntaxNode *)0x0;
            local_c8._16_4_ = SyntaxList;
            local_c8._0_8_ = &PTR_getChild_004ea348;
            local_c8._24_8_ = sVar45;
            local_a8 = attributes;
            pCVar36 = slang::syntax::SyntaxNode::
                      as<slang::syntax::ConcurrentAssertionStatementSyntax>
                                (&pSVar9->super_SyntaxNode);
            unaff_R12 = (FunctionDeclarationSyntax *)
                        slang::syntax::SyntaxFactory::concurrentAssertionMember
                                  (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                                           local_c8,pCVar36);
          }
        }
        uVar44 = (TVar46._0_4_ & 0xffff) - 0x65;
        if ((uVar44 < 0x1e) && ((0x20000005U >> (uVar44 & 0x1f) & 1) != 0)) {
          return &unaff_R12->super_MemberSyntax;
        }
      }
      TVar46 = ParserBase::peek(&this->super_ParserBase,1);
      if ((TVar46.kind == Hash) ||
         (TVar46 = ParserBase::peek(&this->super_ParserBase,1), TVar46.kind == OpenParenthesis)) {
        pPVar39 = parsePrimitiveInstantiation(this,attributes);
        return &pPVar39->super_MemberSyntax;
      }
      TVar46 = ParserBase::peek(&this->super_ParserBase,1);
      if (((TVar46.kind == DoubleColon) &&
          (TVar46 = ParserBase::peek(&this->super_ParserBase,2), TVar46.kind == Identifier)) &&
         (TVar46 = ParserBase::peek(&this->super_ParserBase,3), TVar46.kind == Identifier)) {
        pCVar12 = parseCheckerInstantiation(this,attributes);
        return &pCVar12->super_MemberSyntax;
      }
      pMVar7 = parseVariableDeclaration(this,attributes);
      return pMVar7;
    }
    if (TVar2 == SystemIdentifier) {
      unaff_R12 = (FunctionDeclarationSyntax *)parseElabSystemTask(this,attributes);
LAB_0032558f:
      if (unaff_R12 != (FunctionDeclarationSyntax *)0x0) {
        return &unaff_R12->super_MemberSyntax;
      }
    }
    else if (TVar2 == Semicolon) {
      local_c8._8_8_ = (SyntaxNode *)0x0;
      local_c8._16_4_ = SyntaxList;
      local_c8._0_8_ = &PTR_getChild_004ea348;
      local_70.super_SyntaxListBase.super_SyntaxNode.kind = TokenList;
      local_70.super_SyntaxListBase.childCount = 0;
      local_70.super_span<slang::parsing::Token,_18446744073709551615UL> =
           (span<slang::parsing::Token,_18446744073709551615UL>)ZEXT816(0);
      local_70.super_SyntaxListBase._0_16_ = ZEXT816(0x4e9e50);
      local_c8._24_8_ = sVar45;
      local_a8 = attributes;
      TVar48 = ParserBase::consume(&this->super_ParserBase);
      goto LAB_0032590b;
    }
    goto switchD_00324bea_caseD_a7;
  }
  switch(TVar2) {
  case AliasKeyword:
    pNVar30 = parseNetAlias(this,attributes);
    return &pNVar30->super_MemberSyntax;
  case AlwaysKeyword:
  case AlwaysCombKeyword:
  case AlwaysFFKeyword:
  case AlwaysLatchKeyword:
switchD_00324bea_caseD_a9:
    TVar48 = ParserBase::consume(&this->super_ParserBase);
    local_e0 = &this->factory;
    SVar3 = slang::syntax::SyntaxFacts::getProceduralBlockKind(TVar48.kind);
    bVar1 = false;
LAB_00324c9f:
    local_c8._16_4_ = SyntaxList;
    local_c8._8_8_ = (SyntaxNode *)0x0;
    local_c8._0_8_ = &PTR_getChild_004ea348;
    local_c8._24_8_ = sVar45;
    local_a8 = attributes;
    pSVar9 = parseStatement(this,bVar1,false);
    pPVar10 = slang::syntax::SyntaxFactory::proceduralBlock
                        (local_e0,SVar3,
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_c8,TVar48,
                         pSVar9);
    return &pPVar10->super_MemberSyntax;
  case AssertKeyword:
  case AssumeKeyword:
  case CoverKeyword:
    pCVar36 = (ConcurrentAssertionStatementSyntax *)
              parseAssertionStatement(this,(NamedLabelSyntax *)0x0,(AttrList)ZEXT816(0));
    uVar44 = (pCVar36->super_StatementSyntax).super_SyntaxNode.kind - ImmediateAssertStatement;
    if ((uVar44 < 4) && (uVar44 != 1)) {
      local_c8._8_8_ = (SyntaxNode *)0x0;
      local_c8._16_4_ = SyntaxList;
      local_c8._0_8_ = &PTR_getChild_004ea348;
      local_c8._24_8_ = sVar45;
      local_a8 = attributes;
      pIVar40 = slang::syntax::SyntaxNode::as<slang::syntax::ImmediateAssertionStatementSyntax>
                          ((SyntaxNode *)pCVar36);
      pIVar14 = slang::syntax::SyntaxFactory::immediateAssertionMember
                          (&this->factory,
                           (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_c8,pIVar40);
      return &pIVar14->super_MemberSyntax;
    }
LAB_0032550f:
    local_c8._8_8_ = (SyntaxNode *)0x0;
    local_c8._16_4_ = SyntaxList;
    local_c8._0_8_ = &PTR_getChild_004ea348;
    local_c8._24_8_ = sVar45;
    local_a8 = attributes;
    pCVar36 = slang::syntax::SyntaxNode::as<slang::syntax::ConcurrentAssertionStatementSyntax>
                        ((SyntaxNode *)pCVar36);
    pCVar37 = slang::syntax::SyntaxFactory::concurrentAssertionMember
                        (&this->factory,
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_c8,pCVar36);
    return &pCVar37->super_MemberSyntax;
  case AssignKeyword:
    pCVar28 = parseContinuousAssign(this,attributes);
    return &pCVar28->super_MemberSyntax;
  case BeginKeyword:
    errorIfAttributes(this,attributes);
    if (sVar45 == 0) {
      SVar42 = Token::location(&local_f0);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x940005,SVar42);
      pMVar7 = parseGenerateBlock(this);
      return pMVar7;
    }
    goto LAB_00325893;
  case BindKeyword:
    pBVar25 = parseBindDirective(this,attributes);
    return &pBVar25->super_MemberSyntax;
  case CaseKeyword:
    pCVar26 = parseCaseGenerateConstruct(this,attributes);
    return &pCVar26->super_MemberSyntax;
  case CheckerKeyword:
    pCVar27 = parseCheckerDeclaration(this,attributes);
    return &pCVar27->super_MemberSyntax;
  case ClassKeyword:
    Token::Token(&local_40);
    pCVar33 = parseClassDeclaration(this,attributes,local_40);
    return &pCVar33->super_MemberSyntax;
  case ClockingKeyword:
    goto switchD_00324c45_caseD_7b;
  case ConfigKeyword:
    errorIfAttributes(this,attributes);
    pCVar24 = parseConfigDeclaration(this,attributes);
    return &pCVar24->super_MemberSyntax;
  case ConstraintKeyword:
    pMVar7 = parseConstraint(this,attributes,
                             (span<slang::parsing::Token,_18446744073709551615UL>)ZEXT816(0));
    return pMVar7;
  case CoverGroupKeyword:
    pCVar31 = parseCovergroupDeclaration(this,attributes);
    return &pCVar31->super_MemberSyntax;
  case DefaultKeyword:
switchD_00324bea_caseD_b4:
    TVar46 = ParserBase::peek(&this->super_ParserBase,1);
    if (TVar46.kind == ClockingKeyword) {
switchD_00324c45_caseD_7b:
      pMVar7 = parseClockingDeclaration(this,attributes);
      return pMVar7;
    }
    TVar46 = ParserBase::peek(&this->super_ParserBase,1);
    if ((TVar46.kind == DisableKeyword) && (local_f0.kind == DefaultKeyword)) {
      pMVar7 = parseDefaultDisable(this,attributes);
      return pMVar7;
    }
    break;
  case DefParamKeyword:
    pDVar29 = parseDefParam(this,attributes);
    return &pDVar29->super_MemberSyntax;
  }
switchD_00324bea_caseD_a7:
  bVar1 = slang::syntax::SyntaxFacts::isGateType(local_f0.kind);
  if (bVar1) {
    pPVar39 = parsePrimitiveInstantiation(this,attributes);
    return &pPVar39->super_MemberSyntax;
  }
  bVar1 = slang::syntax::SyntaxFacts::isMethodQualifier(local_f0.kind);
  if (bVar1) {
    Token::Token((Token *)&local_70);
    offset = 0;
    do {
      offset = offset + 1;
      local_70.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase,offset);
      bVar1 = slang::syntax::SyntaxFacts::isMethodQualifier
                        ((TokenKind)local_70.super_SyntaxListBase._vptr_SyntaxListBase);
    } while (bVar1);
    if ((TokenKind)local_70.super_SyntaxListBase._vptr_SyntaxListBase == ConstraintKeyword) {
      local_c8._0_8_ = local_c8 + 0x18;
      local_c8._8_8_ = (SyntaxNode *)0x0;
      local_c8._16_8_ = 4;
      src = extraout_RDX;
      if (offset != 0) {
        do {
          local_d8 = ParserBase::consume(&this->super_ParserBase);
          SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                    ((SmallVectorBase<slang::parsing::Token> *)local_c8,&local_d8);
          src = extraout_RDX_00;
          if ((local_d8.kind != StaticKeyword) &&
             (bVar1 = slang::syntax::SyntaxFacts::isConstraintQualifier(local_d8.kind),
             src = extraout_RDX_01, bVar1)) {
            SVar47 = Token::range(&local_d8);
            this_01 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x60005,SVar47);
            arg = Token::valueText(&local_d8);
            Diagnostic::operator<<(this_01,arg);
            src = extraout_RDX_02;
          }
          offset = offset - 1;
        } while (offset != 0);
      }
      iVar4 = SmallVectorBase<slang::parsing::Token>::copy
                        ((SmallVectorBase<slang::parsing::Token> *)local_c8,
                         (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
      qualifiers.data_._4_4_ = extraout_var;
      qualifiers.data_._0_4_ = iVar4;
      qualifiers.size_ = extraout_RDX_03;
      unaff_R12 = (FunctionDeclarationSyntax *)parseConstraint(this,attributes,qualifiers);
      if ((pointer)local_c8._0_8_ != (pointer)(local_c8 + 0x18)) {
        free((void *)local_c8._0_8_);
      }
LAB_00325880:
      bVar1 = false;
    }
    else if (((TokenKind)local_70.super_SyntaxListBase._vptr_SyntaxListBase == TaskKeyword) ||
            (bVar1 = true,
            (TokenKind)local_70.super_SyntaxListBase._vptr_SyntaxListBase == FunctionKeyword)) {
      SVar47 = Token::range(&local_f0);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x7e0005,SVar47);
      for (; offset != 0; offset = offset - 1) {
        ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x0);
      }
      SVar3 = TaskDeclaration;
      if ((TokenKind)local_70.super_SyntaxListBase._vptr_SyntaxListBase == FunctionKeyword) {
        SVar3 = FunctionDeclaration;
      }
      TVar2 = slang::syntax::SyntaxFacts::getSkipToKind
                        ((TokenKind)local_70.super_SyntaxListBase._vptr_SyntaxListBase);
      unaff_R12 = parseFunctionDeclaration(this,attributes,SVar3,TVar2,parentKind);
      goto LAB_00325880;
    }
    if (!bVar1) {
      return &unaff_R12->super_MemberSyntax;
    }
  }
  if (sVar45 == 0) {
    return (MemberSyntax *)0x0;
  }
LAB_00325893:
  local_c8._8_8_ = (SyntaxNode *)0x0;
  local_c8._16_4_ = SyntaxList;
  local_c8._0_8_ = &PTR_getChild_004ea348;
  local_70.super_SyntaxListBase.super_SyntaxNode.kind = TokenList;
  local_70.super_SyntaxListBase.childCount = 0;
  local_70.super_span<slang::parsing::Token,_18446744073709551615UL> =
       (span<slang::parsing::Token,_18446744073709551615UL>)ZEXT816(0);
  local_70.super_SyntaxListBase._0_16_ = ZEXT816(0x4e9e50);
  alloc = (this->super_ParserBase).alloc;
  local_c8._24_8_ = sVar45;
  local_a8 = attributes;
  SVar42 = Token::location(&local_f0);
  TVar48 = Token::createMissing(alloc,Semicolon,SVar42);
LAB_0032590b:
  pEVar43 = slang::syntax::SyntaxFactory::emptyMember
                      (&this->factory,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_c8
                       ,&local_70,TVar48);
  return &pEVar43->super_MemberSyntax;
}

Assistant:

MemberSyntax* Parser::parseMember(SyntaxKind parentKind, bool& anyLocalModules) {
    auto attributes = parseAttributes();

    if (isHierarchyInstantiation(/* requireName */ false))
        return &parseHierarchyInstantiation(attributes);
    if (isPortDeclaration(/* inStatement */ false))
        return &parsePortDeclaration(attributes);
    if (isNetDeclaration())
        return &parseNetDeclaration(attributes);
    if (isVariableDeclaration())
        return &parseVariableDeclaration(attributes);

    Token token = peek();
    switch (token.kind) {
        case TokenKind::GenerateKeyword: {
            errorIfAttributes(attributes);
            auto keyword = consume();

            Token endgenerate;
            auto members = parseMemberList<MemberSyntax>(
                TokenKind::EndGenerateKeyword, endgenerate, SyntaxKind::GenerateRegion,
                [this](SyntaxKind parentKind, bool& anyLocalModules) {
                    return parseMember(parentKind, anyLocalModules);
                });
            return &factory.generateRegion(attributes, keyword, members, endgenerate);
        }
        case TokenKind::BeginKeyword:
            errorIfAttributes(attributes);
            if (!attributes.empty()) {
                return &factory.emptyMember(attributes, nullptr,
                                            Token::createMissing(alloc, TokenKind::Semicolon,
                                                                 token.location()));
            }

            // It's definitely not legal to have a generate block here on its own
            // (without an if or for loop) but some simulators seems to accept it
            // and I've found code in the wild that depends on it. We'll parse it
            // here and then issue a diagnostic about how it's not kosher.
            addDiag(diag::NonStandardGenBlock, token.location());
            return &parseGenerateBlock();
        case TokenKind::TimeUnitKeyword:
        case TokenKind::TimePrecisionKeyword:
            errorIfAttributes(attributes);
            return &parseTimeUnitsDeclaration(attributes);
        case TokenKind::ModuleKeyword:
        case TokenKind::MacromoduleKeyword:
        case TokenKind::ProgramKeyword:
        case TokenKind::PackageKeyword:
            // modules, interfaces, and programs share the same syntax
            return &parseModule(attributes, parentKind, anyLocalModules);
        case TokenKind::InterfaceKeyword:
            // an interface class is different from an interface
            if (peek(1).kind == TokenKind::ClassKeyword)
                return &parseClassDeclaration(attributes, consume());
            else
                return &parseModule(attributes, parentKind, anyLocalModules);
        case TokenKind::ModPortKeyword:
            return &parseModportDeclaration(attributes);
        case TokenKind::BindKeyword:
            return &parseBindDirective(attributes);
        case TokenKind::SpecParamKeyword:
            return &parseSpecparam(attributes);
        case TokenKind::AliasKeyword:
            return &parseNetAlias(attributes);
        case TokenKind::SpecifyKeyword:
            errorIfAttributes(attributes);
            return &parseSpecifyBlock(attributes);
        case TokenKind::Identifier:
            if (peek(1).kind == TokenKind::Colon) {
                // Declarations and instantiations have already been handled, so if we reach this
                // point we either have a labeled assertion, or this is some kind of error.
                TokenKind next = peek(2).kind;
                if (next == TokenKind::AssertKeyword || next == TokenKind::AssumeKeyword ||
                    next == TokenKind::CoverKeyword) {

                    auto name = consume();
                    auto& label = factory.namedLabel(name, expect(TokenKind::Colon));
                    auto& statement = parseAssertionStatement(&label, {});
                    switch (statement.kind) {
                        case SyntaxKind::ImmediateAssertStatement:
                        case SyntaxKind::ImmediateAssumeStatement:
                        case SyntaxKind::ImmediateCoverStatement:
                            return &factory.immediateAssertionMember(
                                attributes, statement.as<ImmediateAssertionStatementSyntax>());
                        default:
                            return &factory.concurrentAssertionMember(
                                attributes, statement.as<ConcurrentAssertionStatementSyntax>());
                    }
                }
            }

            // If there's a hash or parenthesis here this is likely a primitive instantiation.
            if (peek(1).kind == TokenKind::Hash || peek(1).kind == TokenKind::OpenParenthesis) {
                return &parsePrimitiveInstantiation(attributes);
            }

            // A double colon could be a package-scoped checker instantiation.
            if (peek(1).kind == TokenKind::DoubleColon && peek(2).kind == TokenKind::Identifier &&
                peek(3).kind == TokenKind::Identifier) {
                return &parseCheckerInstantiation(attributes);
            }

            // Otherwise, assume it's an (erroneous) attempt at a variable declaration.
            return &parseVariableDeclaration(attributes);
        case TokenKind::UnitSystemName: {
            // The only valid thing this can be is a checker instantiation, since
            // variable declarations would have been handled previously. Because these
            // are rare, disambiguate for a bit and then fall back to parsing as a
            // variable decl anyway for a better error message.
            if (peek(1).kind == TokenKind::DoubleColon && peek(2).kind == TokenKind::Identifier &&
                peek(3).kind == TokenKind::Identifier) {
                return &parseCheckerInstantiation(attributes);
            }
            return &parseVariableDeclaration(attributes);
        }
        case TokenKind::AssertKeyword:
        case TokenKind::AssumeKeyword:
        case TokenKind::CoverKeyword: {
            auto& statement = parseAssertionStatement(nullptr, {});
            switch (statement.kind) {
                case SyntaxKind::ImmediateAssertStatement:
                case SyntaxKind::ImmediateAssumeStatement:
                case SyntaxKind::ImmediateCoverStatement:
                    return &factory.immediateAssertionMember(
                        attributes, statement.as<ImmediateAssertionStatementSyntax>());
                default:
                    return &factory.concurrentAssertionMember(
                        attributes, statement.as<ConcurrentAssertionStatementSyntax>());
            }
        }
        case TokenKind::RestrictKeyword: {
            auto& statement = parseConcurrentAssertion(nullptr, {});
            return &factory.concurrentAssertionMember(
                attributes, statement.as<ConcurrentAssertionStatementSyntax>());
        }
        case TokenKind::AssignKeyword:
            return &parseContinuousAssign(attributes);
        case TokenKind::InitialKeyword: {
            auto keyword = consume();
            return &factory.proceduralBlock(getProceduralBlockKind(keyword.kind), attributes,
                                            keyword, parseStatement());
        }
        case TokenKind::FinalKeyword:
        case TokenKind::AlwaysKeyword:
        case TokenKind::AlwaysCombKeyword:
        case TokenKind::AlwaysFFKeyword:
        case TokenKind::AlwaysLatchKeyword: {
            auto keyword = consume();
            return &factory.proceduralBlock(getProceduralBlockKind(keyword.kind), attributes,
                                            keyword, parseStatement(false));
        }
        case TokenKind::ForKeyword:
            return &parseLoopGenerateConstruct(attributes);
        case TokenKind::IfKeyword:
            return &parseIfGenerateConstruct(attributes);
        case TokenKind::CaseKeyword:
            return &parseCaseGenerateConstruct(attributes);
        case TokenKind::GenVarKeyword:
            return &parseGenvarDeclaration(attributes);
        case TokenKind::TaskKeyword:
            return &parseFunctionDeclaration(attributes, SyntaxKind::TaskDeclaration,
                                             TokenKind::EndTaskKeyword, parentKind);
        case TokenKind::FunctionKeyword:
            return &parseFunctionDeclaration(attributes, SyntaxKind::FunctionDeclaration,
                                             TokenKind::EndFunctionKeyword, parentKind);
        case TokenKind::CoverGroupKeyword:
            return &parseCovergroupDeclaration(attributes);
        case TokenKind::ClassKeyword:
            return &parseClassDeclaration(attributes, Token());
        case TokenKind::VirtualKeyword:
            if (peek(1).kind == TokenKind::ClassKeyword)
                return &parseClassDeclaration(attributes, consume());
            break;
        case TokenKind::DefParamKeyword:
            return &parseDefParam(attributes);
        case TokenKind::ImportKeyword:
            if (peek(1).kind == TokenKind::StringLiteral) {
                return &parseDPIImport(attributes);
            }
            return &parseImportDeclaration(attributes);
        case TokenKind::ExportKeyword:
            if (peek(1).kind == TokenKind::StringLiteral) {
                return &parseDPIExport(attributes);
            }
            return &parseExportDeclaration(attributes);
        case TokenKind::Semicolon:
            return &factory.emptyMember(attributes, nullptr, consume());
        case TokenKind::PropertyKeyword:
            return &parsePropertyDeclaration(attributes);
        case TokenKind::SequenceKeyword:
            return &parseSequenceDeclaration(attributes);
        case TokenKind::CheckerKeyword:
            return &parseCheckerDeclaration(attributes);
        case TokenKind::GlobalKeyword:
        case TokenKind::DefaultKeyword:
            if (peek(1).kind == TokenKind::ClockingKeyword) {
                return &parseClockingDeclaration(attributes);
            }
            else if (peek(1).kind == TokenKind::DisableKeyword &&
                     token.kind == TokenKind::DefaultKeyword) {
                return &parseDefaultDisable(attributes);
            }
            break;
        case TokenKind::ClockingKeyword:
            return &parseClockingDeclaration(attributes);
        case TokenKind::SystemIdentifier: {
            auto result = parseElabSystemTask(attributes);
            if (result)
                return result;
            break;
        }
        case TokenKind::ConstraintKeyword:
            return &parseConstraint(attributes, {});
        case TokenKind::PrimitiveKeyword:
            return &parseUdpDeclaration(attributes);
        case TokenKind::RandKeyword: {
            auto rand = consume();
            return &factory.checkerDataDeclaration(attributes, rand, parseDataDeclaration({}));
        }
        case TokenKind::ExternKeyword:
            errorIfAttributes(attributes);
            if (auto member = parseExternMember(parentKind, attributes))
                return member;
            break;
        case TokenKind::ConfigKeyword:
            errorIfAttributes(attributes);
            return &parseConfigDeclaration(attributes);
        default:
            break;
    }

    if (isGateType(token.kind))
        return &parsePrimitiveInstantiation(attributes);

    // If this is a class qualifier, maybe they accidentally put them
    // on an out-of-block method definition.
    if (isMethodQualifier(token.kind)) {
        Token t;
        uint32_t index = 0;
        do {
            t = peek(++index);
        } while (isMethodQualifier(t.kind));

        if (t.kind == TokenKind::FunctionKeyword || t.kind == TokenKind::TaskKeyword) {
            // Skip all the qualifiers.
            addDiag(diag::QualifiersOnOutOfBlock, token.range());
            for (uint32_t i = 0; i < index; i++)
                skipToken(std::nullopt);

            auto kind = t.kind == TokenKind::FunctionKeyword ? SyntaxKind::FunctionDeclaration
                                                             : SyntaxKind::TaskDeclaration;
            return &parseFunctionDeclaration(attributes, kind, getSkipToKind(t.kind), parentKind);
        }

        if (t.kind == TokenKind::ConstraintKeyword) {
            // Out-of-block constraints can legitimately have the 'static' keyword,
            // but nothing else.
            SmallVector<Token, 4> quals;
            for (uint32_t i = 0; i < index; i++) {
                Token qual = consume();
                quals.push_back(qual);

                if (qual.kind != TokenKind::StaticKeyword && isConstraintQualifier(qual.kind))
                    addDiag(diag::ConstraintQualOutOfBlock, qual.range()) << qual.valueText();
            }

            return &parseConstraint(attributes, quals.copy(alloc));
        }
    }

    // if we got attributes but don't know what comes next, we have some kind of nonsense
    if (!attributes.empty()) {
        return &factory.emptyMember(attributes, nullptr,
                                    Token::createMissing(alloc, TokenKind::Semicolon,
                                                         token.location()));
    }

    // Otherwise, we got nothing and should just return null so that our
    // caller will skip and try again.
    return nullptr;
}